

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

int strlen_color(char *argument)

{
  short length;
  char *str;
  char *argument_local;
  int local_4;
  
  if ((argument == (char *)0x0) || (*argument == '\0')) {
    local_4 = 0;
  }
  else {
    length = 0;
    str = argument;
    while (*str != '\0') {
      if (*str == '{') {
        switch(str[1]) {
        case '-':
        case 'x':
          length = length + 1;
          break;
        default:
          length = length + 2;
          break;
        case '0':
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7':
        case '<':
        case 'B':
        case 'F':
        case 'b':
        case 'f':
        case 'n':
        }
        str = str + 2;
      }
      else {
        str = str + 1;
        length = length + 1;
      }
    }
    local_4 = (int)length;
  }
  return local_4;
}

Assistant:

int strlen_color(char *argument)
{
	char *str;
	short length;

	if (argument == nullptr || argument[0] == '\0')
		return 0;

	length = 0;
	str = argument;

	while (*str != '\0')
	{
		if (*str != '{')
		{
			str++;
			length++;
			continue;
		}

		switch (*(++str))
		{
			case '-':
			case 'x':
				length++;
				break;
			case '<':
			case '0':
			case '1':
			case '2':
			case '3':
			case '4':
			case '5':
			case '6':
			case '7':
			case 'B':
			case 'b':
			case 'F':
			case 'f':
			case 'n':
				break;
			default:
				length += 2;
				break;
		}

		str++;
	}

	return length;
}